

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopOper.c
# Opt level: O0

Hop_Obj_t * Hop_Multi_rec(Hop_Man_t *p,Hop_Obj_t **ppObjs,int nObjs,Hop_Type_t Type)

{
  Hop_Obj_t *p0;
  Hop_Obj_t *p1;
  Hop_Obj_t *pObj2;
  Hop_Obj_t *pObj1;
  Hop_Type_t Type_local;
  int nObjs_local;
  Hop_Obj_t **ppObjs_local;
  Hop_Man_t *p_local;
  
  if (nObjs == 1) {
    p_local = (Hop_Man_t *)*ppObjs;
  }
  else {
    p0 = Hop_Multi_rec(p,ppObjs,nObjs / 2,Type);
    p1 = Hop_Multi_rec(p,ppObjs + nObjs / 2,nObjs - nObjs / 2,Type);
    p_local = (Hop_Man_t *)Hop_Oper(p,p0,p1,Type);
  }
  return (Hop_Obj_t *)p_local;
}

Assistant:

Hop_Obj_t * Hop_Multi_rec( Hop_Man_t * p, Hop_Obj_t ** ppObjs, int nObjs, Hop_Type_t Type )
{
    Hop_Obj_t * pObj1, * pObj2;
    if ( nObjs == 1 )
        return ppObjs[0];
    pObj1 = Hop_Multi_rec( p, ppObjs,           nObjs/2,         Type );
    pObj2 = Hop_Multi_rec( p, ppObjs + nObjs/2, nObjs - nObjs/2, Type );
    return Hop_Oper( p, pObj1, pObj2, Type );
}